

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

int __thiscall Time::Time::toDate(Time *this,char *buffer,bool iso8601)

{
  int iVar1;
  tm ekT;
  long local_28;
  
  if (buffer != (char *)0x0) {
    ekT.tm_isdst = 0;
    ekT._36_4_ = 0;
    ekT.tm_gmtoff = 0;
    ekT.tm_mon = 0;
    ekT.tm_year = 0;
    ekT.tm_wday = 0;
    ekT.tm_yday = 0;
    ekT.tm_sec = 0;
    ekT.tm_min = 0;
    ekT.tm_hour = 0;
    ekT.tm_mday = 0;
    ekT.tm_zone = (char *)0x0;
    local_28 = (long)((double)(this->timeSinceEpoch).tv_usec * 1e-06 +
                     (double)(this->timeSinceEpoch).tv_sec);
    gmtime_r(&local_28,(tm *)&ekT);
    if (iso8601) {
      iVar1 = sprintf(buffer,"%04d-%02d-%02dT%02d:%02d:%02dZ",(ulong)(ekT.tm_year + 0x76c),
                      (ulong)(ekT.tm_mon + 1),(ulong)(uint)ekT.tm_mday,ekT._8_8_ & 0xffffffff,
                      (ulong)(uint)ekT.tm_min,ekT._0_8_ & 0xffffffff);
    }
    else {
      iVar1 = sprintf(buffer,"%s, %02d %s %04d %02d:%02d:%02d %s",
                      &DAT_001231c0 + *(int *)(&DAT_001231c0 + (long)ekT.tm_wday * 4),
                      (ulong)(uint)ekT.tm_mday,(&PTR_anon_var_dwarf_21b7b_00131500)[ekT.tm_mon],
                      (ulong)(ekT.tm_year + 0x76c),ekT._8_8_ & 0xffffffff,(ulong)(uint)ekT.tm_min,
                      ekT._0_8_ & 0xffffffff,"GMT");
      iVar1 = iVar1 + 1;
    }
    return iVar1;
  }
  return 0x1e;
}

Assistant:

int Time::toDate(char * buffer, const bool iso8601) const
    {
#if defined(_WIN32) || defined(_POSIX)
        if (!buffer) return 30;
        const char * monthName[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
        const char * dayName[] = { "Sun", "Mon", "Tue", "Wed", "Thr", "Fri", "Sat" };
        
        struct tm ekT = {0};
        time_t t = (time_t)preciseTime();
        makeUTCTime(t, ekT);
        if (iso8601)
            return sprintf(buffer, "%04d-%02d-%02dT%02d:%02d:%02dZ", ekT.tm_year + 1900, ekT.tm_mon + 1, ekT.tm_mday, ekT.tm_hour, ekT.tm_min, ekT.tm_sec);
        return sprintf(buffer, "%s, %02d %s %04d %02d:%02d:%02d %s", dayName[ekT.tm_wday], ekT.tm_mday, monthName[ekT.tm_mon], ekT.tm_year + 1900, ekT.tm_hour, ekT.tm_min, ekT.tm_sec, "GMT") + 1;
#else
        if (iso8601)
            return sprintf(buffer, "1970-01-01T00:00:00Z");
        strcpy(buffer, "Sun, 01 Jan 1970 00:00:00 GMT");
        return strlen(buffer);
#endif        
    }